

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

float refineBySAT(Abc_Ntk_t *pNtk1,Vec_Int_t **iMatch1,int *iGroup1,Vec_Int_t **iDep1,
                 int *iLastItem1,Vec_Int_t **oMatch1,int *oGroup1,Vec_Int_t **oDep1,int *oLastItem1,
                 int *observability1,Abc_Ntk_t *pNtk2,Vec_Int_t **iMatch2,int *iGroup2,
                 Vec_Int_t **iDep2,int *iLastItem2,Vec_Int_t **oMatch2,int *oGroup2,
                 Vec_Int_t **oDep2,int *oLastItem2,int *observability2)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  int iVar4;
  Vec_Int_t *iNonSingleton;
  int *piVar5;
  Vec_Int_t *p;
  Vec_Int_t *matchedInputs2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t **nodesInLevel1;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t **nodesInLevel2;
  Vec_Int_t *oMatchedGroups;
  Vec_Int_t *pVVar8;
  Abc_Ntk_t *subNtk1;
  Abc_Ntk_t *subNtk2;
  FILE *__stream;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  long local_60;
  timespec ts;
  
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_60 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iNonSingleton = (Vec_Int_t *)malloc(0x10);
  iNonSingleton->nCap = 0x10;
  iNonSingleton->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  iNonSingleton->pArray = piVar5;
  iVar4 = pNtk1->vPis->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar4 - 1U < 0xf) {
    iVar4 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar5;
  iVar4 = pNtk2->vPis->nSize;
  matchedInputs2 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar14 = iVar4;
  }
  matchedInputs2->nSize = 0;
  matchedInputs2->nCap = iVar14;
  if (iVar14 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar14 << 2);
  }
  matchedInputs2->pArray = piVar5;
  iVar4 = pNtk1->vPos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar4 - 1U < 0xf) {
    iVar4 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar5;
  iVar4 = pNtk2->vPos->nSize;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar14 = iVar4;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar14;
  if (iVar14 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar14 << 2);
  }
  p_01->pArray = piVar5;
  iVar4 = Abc_AigLevel(pNtk1);
  nodesInLevel1 = (Vec_Ptr_t **)malloc((long)iVar4 * 8 + 8);
  iVar4 = Abc_AigLevel(pNtk1);
  if (-1 < iVar4) {
    lVar12 = -1;
    do {
      pVVar6 = (Vec_Ptr_t *)malloc(0x10);
      pVVar6->nCap = 0x14;
      pVVar6->nSize = 0;
      ppvVar7 = (void **)malloc(0xa0);
      pVVar6->pArray = ppvVar7;
      nodesInLevel1[lVar12 + 1] = pVVar6;
      iVar4 = Abc_AigLevel(pNtk1);
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  pVVar6 = pNtk1->vObjs;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      puVar3 = (undefined8 *)pVVar6->pArray[lVar12];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_0029de06;
        if (*(int *)*puVar3 != 3) goto LAB_0029ddfd;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          pVVar6 = nodesInLevel1[*(uint *)((long)puVar3 + 0x14) >> 0xc];
          uVar1 = pVVar6->nSize;
          if (uVar1 == pVVar6->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar7 = pVVar6->pArray;
          }
          iVar4 = pVVar6->nSize;
          pVVar6->nSize = iVar4 + 1;
          ppvVar7[iVar4] = puVar3;
          pVVar6 = pNtk1->vObjs;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar6->nSize);
  }
  iVar4 = Abc_AigLevel(pNtk2);
  nodesInLevel2 = (Vec_Ptr_t **)malloc((long)iVar4 * 8 + 8);
  iVar4 = Abc_AigLevel(pNtk2);
  if (-1 < iVar4) {
    lVar12 = -1;
    do {
      pVVar6 = (Vec_Ptr_t *)malloc(0x10);
      pVVar6->nCap = 0x14;
      pVVar6->nSize = 0;
      ppvVar7 = (void **)malloc(0xa0);
      pVVar6->pArray = ppvVar7;
      nodesInLevel2[lVar12 + 1] = pVVar6;
      iVar4 = Abc_AigLevel(pNtk2);
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  pVVar6 = pNtk2->vObjs;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      puVar3 = (undefined8 *)pVVar6->pArray[lVar12];
      if (puVar3 != (undefined8 *)0x0) {
        if (((ulong)puVar3 & 1) != 0) goto LAB_0029de06;
        if (*(int *)*puVar3 != 3) goto LAB_0029ddfd;
        if (*(int *)((long)puVar3 + 0x1c) == 2) {
          pVVar6 = nodesInLevel2[*(uint *)((long)puVar3 + 0x14) >> 0xc];
          uVar1 = pVVar6->nSize;
          if (uVar1 == pVVar6->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar7 = pVVar6->pArray;
          }
          iVar4 = pVVar6->nSize;
          pVVar6->nSize = iVar4 + 1;
          ppvVar7[iVar4] = puVar3;
          pVVar6 = pNtk2->vObjs;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar6->nSize);
  }
  oMatchedGroups = (Vec_Int_t *)malloc(0x10);
  oMatchedGroups->nCap = 0x10;
  oMatchedGroups->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  oMatchedGroups->pArray = piVar5;
  if (0 < *iLastItem1) {
    lVar12 = 0;
    do {
      if (iMatch1[lVar12]->nSize == 1) {
        Vec_IntPush(p,*iMatch1[lVar12]->pArray);
        lVar11 = (long)iMatch2[lVar12]->nSize;
        if (lVar11 < 1) goto LAB_0029de25;
        iVar4 = iMatch2[lVar12]->pArray[lVar11 + -1];
        pVVar8 = matchedInputs2;
      }
      else {
        iVar4 = (int)lVar12;
        pVVar8 = iNonSingleton;
      }
      Vec_IntPush(pVVar8,iVar4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < *iLastItem1);
  }
  iVar4 = *oLastItem1;
  if (0 < iVar4) {
    lVar12 = 0;
    do {
      if (oMatch1[lVar12]->nSize == 1) {
        Vec_IntPush(p_00,*oMatch1[lVar12]->pArray);
        lVar11 = (long)oMatch2[lVar12]->nSize;
        if (lVar11 < 1) {
LAB_0029de25:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        Vec_IntPush(p_01,oMatch2[lVar12]->pArray[lVar11 + -1]);
        iVar4 = *oLastItem1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  iVar4 = iNonSingleton->nSize;
  if (1 < iVar4) {
    lVar11 = 1;
    lVar12 = 0;
    do {
      lVar13 = lVar12 + 1;
      if (lVar13 < iVar4) {
        piVar5 = iNonSingleton->pArray;
        lVar16 = lVar11;
        do {
          uVar1 = iMatch2[piVar5[lVar16]]->nSize;
          if (((int)uVar1 < 1) || (iVar4 <= lVar12)) goto LAB_0029dda0;
          iVar4 = piVar5[lVar12];
          uVar2 = iMatch2[iVar4]->nSize;
          if ((int)uVar2 < 1) goto LAB_0029dda0;
          if ((observability2[*iMatch2[iVar4]->pArray] <
               observability2[*iMatch2[piVar5[lVar16]]->pArray]) ||
             ((uVar1 < uVar2 &&
              (observability2[*iMatch2[piVar5[lVar16]]->pArray] ==
               observability2[*iMatch2[iVar4]->pArray])))) {
            piVar5[lVar12] = piVar5[lVar16];
            if (iNonSingleton->nSize <= lVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            piVar5[lVar16] = iVar4;
          }
          lVar16 = lVar16 + 1;
          iVar4 = iNonSingleton->nSize;
        } while ((int)lVar16 < iVar4);
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar13;
    } while (lVar13 < iVar4 + -1);
  }
  iVar4 = match1by1(pNtk1,nodesInLevel1,iMatch1,iDep1,p,iGroup1,oMatch1,oGroup1,pNtk2,nodesInLevel2,
                    iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,p_00,p_01,oMatchedGroups,
                    iNonSingleton,0,0);
  if (iVar4 == 0) {
    bVar17 = true;
  }
  else {
    iVar4 = pNtk1->vPos->nSize;
    if (p_00->nSize == iVar4) {
      bVar17 = false;
    }
    else {
      pVVar8 = (Vec_Int_t *)malloc(0x10);
      pVVar8->nCap = 0x10;
      pVVar8->nSize = 0;
      piVar5 = (int *)malloc(0x40);
      pVVar8->pArray = piVar5;
      pVVar6 = (Vec_Ptr_t *)malloc(0x10);
      iVar14 = 8;
      if (6 < iVar4 * 2 - 1U) {
        iVar14 = iVar4 * 2;
      }
      pVVar6->nSize = 0;
      pVVar6->nCap = iVar14;
      if (iVar14 == 0) {
        ppvVar7 = (void **)0x0;
      }
      else {
        ppvVar7 = (void **)malloc((long)iVar14 << 3);
      }
      pVVar6->pArray = ppvVar7;
      iVar4 = *oLastItem1;
      if (0 < iVar4) {
        uVar15 = 0;
        do {
          if (1 < oMatch1[uVar15]->nSize) {
            if (0 < (long)oMatchedGroups->nSize) {
              lVar12 = 0;
              do {
                if (uVar15 == (uint)oMatchedGroups->pArray[lVar12]) goto LAB_0029d8ab;
                lVar12 = lVar12 + 1;
              } while (oMatchedGroups->nSize != lVar12);
            }
            Vec_IntPush(pVVar8,(int)uVar15);
            iVar4 = *oLastItem1;
          }
LAB_0029d8ab:
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)iVar4);
      }
      subNtk1 = computeCofactor(pNtk1,nodesInLevel1,(int *)0x0,p);
      subNtk2 = computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
      iVar4 = matchNonSingletonOutputs
                        (pNtk1,nodesInLevel1,iMatch1,iDep1,p,iGroup1,oMatch1,oGroup1,pNtk2,
                         nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup1,oMatch2,oGroup2,p_00,
                         p_01,oMatchedGroups,(Vec_Int_t *)0x0,subNtk1,subNtk2,pVVar6,pVVar8,0,0,0,0)
      ;
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      if (pVVar6->pArray != (void **)0x0) {
        free(pVVar6->pArray);
      }
      free(pVVar6);
      Abc_NtkDelete(subNtk1);
      Abc_NtkDelete(subNtk2);
      bVar17 = iVar4 == 0;
    }
  }
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  if (!bVar17) {
    checkEquivalence(pNtk1,p,p_00,pNtk2,matchedInputs2,p_01);
    __stream = fopen("IOmatch.txt","w");
    fprintf(__stream,"I/O = %d / %d \n\n",(ulong)(uint)pNtk1->vPis->nSize,
            (ulong)(uint)pNtk1->vPos->nSize);
    iVar4 = p->nSize;
    if (0 < (long)iVar4) {
      piVar5 = p->pArray;
      lVar11 = 0;
      do {
        iVar14 = piVar5[lVar11];
        if (((long)iVar14 < 0) || (pNtk1->vPis->nSize <= iVar14)) goto LAB_0029ddde;
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk1->vPis->pArray[iVar14]);
        if (matchedInputs2->nSize <= lVar11) goto LAB_0029dda0;
        iVar14 = matchedInputs2->pArray[lVar11];
        if (((long)iVar14 < 0) || (pNtk2->vPis->nSize <= iVar14)) goto LAB_0029ddde;
        pcVar10 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPis->pArray[iVar14]);
        fprintf(__stream,"{%s}\t{%s}\n",pcVar9,pcVar10);
        lVar11 = lVar11 + 1;
      } while (iVar4 != lVar11);
    }
    fwrite("\n-----------------------------------------\n",0x2b,1,__stream);
    iVar4 = p_00->nSize;
    if (0 < (long)iVar4) {
      piVar5 = p_00->pArray;
      lVar11 = 0;
      do {
        iVar14 = piVar5[lVar11];
        if (((long)iVar14 < 0) || (pNtk1->vPos->nSize <= iVar14)) {
LAB_0029ddde:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk1->vPos->pArray[iVar14]);
        if (p_01->nSize <= lVar11) {
LAB_0029dda0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar14 = p_01->pArray[lVar11];
        if (((long)iVar14 < 0) || (pNtk2->vPos->nSize <= iVar14)) goto LAB_0029ddde;
        pcVar10 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPos->pArray[iVar14]);
        fprintf(__stream,"{%s}\t{%s}\n",pcVar9,pcVar10);
        lVar11 = lVar11 + 1;
      } while (iVar4 != lVar11);
    }
    fclose(__stream);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (matchedInputs2->pArray != (int *)0x0) {
    free(matchedInputs2->pArray);
  }
  free(matchedInputs2);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (iNonSingleton->pArray != (int *)0x0) {
    free(iNonSingleton->pArray);
  }
  free(iNonSingleton);
  if (oMatchedGroups->pArray != (int *)0x0) {
    free(oMatchedGroups->pArray);
  }
  free(oMatchedGroups);
  iVar4 = Abc_AigLevel(pNtk1);
  if (-1 < iVar4) {
    lVar11 = -1;
    do {
      pVVar6 = nodesInLevel1[lVar11 + 1];
      ppvVar7 = pVVar6->pArray;
      if (ppvVar7 != (void **)0x0) {
        free(ppvVar7);
      }
      free(pVVar6);
      iVar4 = Abc_AigLevel(pNtk1);
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar4);
  }
  iVar4 = Abc_AigLevel(pNtk2);
  if (-1 < iVar4) {
    lVar11 = -1;
    do {
      pVVar6 = nodesInLevel2[lVar11 + 1];
      ppvVar7 = pVVar6->pArray;
      if (ppvVar7 != (void **)0x0) {
        free(ppvVar7);
      }
      free(pVVar6);
      iVar4 = Abc_AigLevel(pNtk2);
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar4);
  }
  if (nodesInLevel1 != (Vec_Ptr_t **)0x0) {
    free(nodesInLevel1);
  }
  if (nodesInLevel2 != (Vec_Ptr_t **)0x0) {
    free(nodesInLevel2);
  }
  return (float)(lVar12 + local_60) / 1e+06;
LAB_0029de06:
  pcVar9 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_0029de0d;
LAB_0029ddfd:
  pcVar9 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_0029de0d:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
                 Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2)
{
    int i, j;    
    Abc_Obj_t * pObj;
    Vec_Int_t * iNonSingleton;
    Vec_Int_t * matchedInputs1, * matchedInputs2;
    Vec_Int_t * matchedOutputs1, * matchedOutputs2;
    Vec_Ptr_t ** nodesInLevel1, ** nodesInLevel2;
    Vec_Int_t * oMatchedGroups;
    FILE *result;    
    int matchFound;
    abctime clk = Abc_Clock();
    float satTime = 0.0;

    /*matchFile = fopen("satmatch.txt", "w");*/
    
    iNonSingleton = Vec_IntAlloc(10);    
    
    matchedInputs1 = Vec_IntAlloc( Abc_NtkPiNum(pNtk1) );
    matchedInputs2 = Vec_IntAlloc( Abc_NtkPiNum(pNtk2) );

    matchedOutputs1 = Vec_IntAlloc( Abc_NtkPoNum(pNtk1) );
    matchedOutputs2 = Vec_IntAlloc( Abc_NtkPoNum(pNtk2) );

    nodesInLevel1 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk1 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)
        nodesInLevel1[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk1, pObj, i )    
        Vec_PtrPush(nodesInLevel1[Abc_ObjLevel(pObj)], pObj);
    
    nodesInLevel2 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk2 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)
        nodesInLevel2[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk2, pObj, i )    
        Vec_PtrPush(nodesInLevel2[Abc_ObjLevel(pObj)], pObj);    

    oMatchedGroups = Vec_IntAlloc( 10 );

    for(i = 0; i < *iLastItem1; i++)
    {
        if(Vec_IntSize(iMatch1[i]) == 1)
        {
            Vec_IntPush(matchedInputs1, Vec_IntEntryLast(iMatch1[i]));
            Vec_IntPush(matchedInputs2, Vec_IntEntryLast(iMatch2[i]));        
        }
        else
            Vec_IntPush(iNonSingleton, i);
    }

    for(i = 0; i < *oLastItem1; i++)
    {
        if(Vec_IntSize(oMatch1[i]) == 1)
        {
            Vec_IntPush(matchedOutputs1, Vec_IntEntryLast(oMatch1[i]));
            Vec_IntPush(matchedOutputs2, Vec_IntEntryLast(oMatch2[i]));
        }
    }
    
    for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] == 
                     observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {
                if( Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, j)]) < Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, i)]) )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }    

    /*for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) > 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) == 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {
                if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                        observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }*/

    matchFound = match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                           pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, 0, 0);

    if( matchFound && Vec_IntSize(matchedOutputs1) != Abc_NtkPoNum(pNtk1) )
    {
        Vec_Int_t * oNonSingleton;
        Vec_Ptr_t * oMatchPairs;
        Abc_Ntk_t * subNtk1, * subNtk2;

        oNonSingleton = Vec_IntAlloc( 10 );
        
        oMatchPairs = Vec_PtrAlloc(Abc_NtkPoNum(pNtk1) * 2);    

        for(i = 0; i < *oLastItem1; i++)
            if( Vec_IntSize(oMatch1[i]) > 1 && Vec_IntFind( oMatchedGroups, i) == -1 )
                Vec_IntPush(oNonSingleton, i);
            
        subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);
        
        matchFound = matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                 pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup1, oMatch2, oGroup2,
                                 matchedOutputs1, matchedOutputs2, oMatchedGroups, NULL,                         
                                 subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, 0, 0);

        Vec_IntFree( oNonSingleton );        
        Vec_PtrFree( oMatchPairs );

        Abc_NtkDelete(subNtk1);
        Abc_NtkDelete(subNtk2);
    }

    satTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);    

    if( matchFound )
    {
          checkEquivalence( pNtk1, matchedInputs1, matchedOutputs1, pNtk2, matchedInputs2, matchedOutputs2);

        result = fopen("IOmatch.txt", "w");

        fprintf(result, "I/O = %d / %d \n\n", Abc_NtkPiNum(pNtk1), Abc_NtkPoNum(pNtk1));
        
        for(i = 0; i < Vec_IntSize(matchedInputs1) ; i++)
              fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i))), Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i))) );                                    

        fprintf(result, "\n-----------------------------------------\n");

        for(i = 0; i < Vec_IntSize(matchedOutputs1) ; i++)
            fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i))), Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i))) );                                    

        fclose( result );    
    }

    Vec_IntFree( matchedInputs1 );
    Vec_IntFree( matchedInputs2 );
    Vec_IntFree( matchedOutputs1 );
    Vec_IntFree( matchedOutputs2 );
    Vec_IntFree( iNonSingleton );
    Vec_IntFree( oMatchedGroups );
    
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)    
        Vec_PtrFree( nodesInLevel1[i] );
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)    
        Vec_PtrFree( nodesInLevel2[i] );
    

    ABC_FREE( nodesInLevel1 );
    ABC_FREE( nodesInLevel2 );
    /*fclose(matchFile);*/
    
    return satTime;
}